

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

float * __thiscall ImVector<float>::insert(ImVector<float> *this,float *it,float *v)

{
  int iVar1;
  int new_capacity;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  float *pfVar6;
  
  pfVar6 = this->Data;
  if (pfVar6 <= it) {
    iVar1 = this->Size;
    lVar3 = (long)iVar1;
    if (it <= pfVar6 + lVar3) {
      lVar5 = (long)it - (long)pfVar6;
      if (iVar1 == this->Capacity) {
        if (iVar1 == 0) {
          iVar2 = 8;
        }
        else {
          iVar2 = iVar1 / 2 + iVar1;
        }
        new_capacity = iVar1 + 1;
        if (iVar1 + 1 < iVar2) {
          new_capacity = iVar2;
        }
        reserve(this,new_capacity);
        lVar3 = (long)this->Size;
        pfVar6 = this->Data;
      }
      lVar4 = lVar3 - (lVar5 >> 2);
      if (lVar4 != 0 && lVar5 >> 2 <= lVar3) {
        memmove((void *)((long)pfVar6 + lVar5 + 4),(void *)((long)pfVar6 + lVar5),lVar4 * 4);
        pfVar6 = this->Data;
      }
      *(float *)((long)pfVar6 + lVar5) = *v;
      this->Size = this->Size + 1;
      return (float *)(lVar5 + (long)this->Data);
    }
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                ,0x4f2,"T *ImVector<float>::insert(const T *, const T &) [T = float]");
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }